

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

void i4mat_print_some(int m,int n,int *a,int ilo,int jlo,int ihi,int jhi,string *title)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int *piVar9;
  ulong uVar10;
  uint uVar11;
  int *local_78;
  int *local_70;
  ulong local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(title->_M_dataplus)._M_p,title->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  if (0 < n && 0 < m) {
    if (jlo <= jhi) {
      lVar8 = (long)jlo;
      uVar6 = (ulong)(uint)m;
      local_48 = lVar8 - 1;
      local_70 = a + local_48 * uVar6 + -1;
      do {
        iVar1 = (int)lVar8;
        iVar2 = i4_min(iVar1 + 9,n);
        iVar2 = i4_min(iVar2,jhi);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Col:",6);
        if (iVar1 <= iVar2) {
          uVar10 = local_48 & 0xffffffff;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
            *(undefined8 *)(fesetround + *(long *)(std::cout + -0x18)) = 6;
            std::ostream::operator<<((ostream *)&std::cout,(int)uVar10);
            uVar11 = (int)uVar10 + 1;
            uVar10 = (ulong)uVar11;
          } while ((int)uVar11 < iVar2);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Row\n",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        iVar3 = i4_max(ilo,1);
        iVar4 = i4_min(ihi,m);
        if (iVar3 <= iVar4) {
          lVar7 = (long)iVar3;
          local_78 = local_70 + lVar7;
          do {
            *(undefined8 *)(fesetround + *(long *)(std::cout + -0x18)) = 5;
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar7 + -1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
            piVar9 = local_78;
            uVar10 = local_48;
            if (iVar1 <= iVar2) {
              do {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
                *(undefined8 *)(fesetround + *(long *)(std::cout + -0x18)) = 6;
                std::ostream::operator<<((ostream *)&std::cout,*piVar9);
                uVar10 = uVar10 + 1;
                piVar9 = piVar9 + uVar6;
              } while ((long)uVar10 < (long)iVar2);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
            lVar7 = lVar7 + 1;
            local_78 = local_78 + 1;
          } while (iVar4 + 1 != (int)lVar7);
        }
        lVar8 = lVar8 + 10;
        local_48 = local_48 + 10;
        local_70 = local_70 + uVar6 * 10;
      } while ((int)lVar8 <= jhi);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  (None)\n",9);
  return;
}

Assistant:

void i4mat_print_some ( int m, int n, int a[], int ilo, int jlo, int ihi,
  int jhi, std::string title )

//****************************************************************************80
//
//  Purpose:
//
//    I4MAT_PRINT_SOME prints some of an I4MAT.
//
//  Discussion:
//
//    An I4MAT is an MxN array of I4's, stored by (I,J) -> [I+J*M].
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    20 August 2010
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, the number of rows of the matrix.
//    M must be positive.
//
//    Input, int N, the number of columns of the matrix.
//    N must be positive.
//
//    Input, int A[M*N], the matrix.
//
//    Input, int ILO, JLO, IHI, JHI, designate the first row and
//    column, and the last row and column to be printed.
//
//    Input, string TITLE, a title.
//
{
# define INCX 10

  int i;
  int i2hi;
  int i2lo;
  int j;
  int j2hi;
  int j2lo;

  std::cout << "\n";
  std::cout << title << "\n";

  if ( m <= 0 || n <= 0 )
  {
    std::cout << "\n";
    std::cout << "  (None)\n";
    return;
  }
//
//  Print the columns of the matrix, in strips of INCX.
//
  for ( j2lo = jlo; j2lo <= jhi; j2lo = j2lo + INCX )
  {
    j2hi = j2lo + INCX - 1;
    j2hi = i4_min ( j2hi, n );
    j2hi = i4_min ( j2hi, jhi );

    std::cout << "\n";
//
//  For each column J in the current range...
//
//  Write the header.
//
    std::cout << "  Col:";
    for ( j = j2lo; j <= j2hi; j++ )
    {
      std::cout << "  " << std::setw(6) << j - 1;
    }
    std::cout << "\n";
    std::cout << "  Row\n";
    std::cout << "\n";
//
//  Determine the range of the rows in this strip.
//
    i2lo = i4_max ( ilo, 1 );
    i2hi = i4_min ( ihi, m );

    for ( i = i2lo; i <= i2hi; i++ )
    {
//
//  Print out (up to INCX) entries in row I, that lie in the current strip.
//
      std::cout << std::setw(5) << i - 1 << ":";
      for ( j = j2lo; j <= j2hi; j++ )
      {
        std::cout << "  " << std::setw(6) << a[i-1+(j-1)*m];
      }
      std::cout << "\n";
    }
  }

  return;
# undef INCX
}